

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtzobj.cpp
# Opt level: O0

void __thiscall CVmObjTimeZone::save_to_file(CVmObjTimeZone *this,CVmFile *fp)

{
  CVmTimeZone *zone;
  vm_tzobj_ext *pvVar1;
  CVmObjTimeZone *in_RDI;
  vmtzquery q;
  char *name;
  size_t namelen;
  CVmTimeZone *tz;
  int in_stack_ffffffffffffffbc;
  CVmFile *in_stack_ffffffffffffffc0;
  CVmTimeZone *in_stack_ffffffffffffffc8;
  CVmTimeZone *in_stack_ffffffffffffffd0;
  
  pvVar1 = get_ext(in_RDI);
  zone = pvVar1->tz;
  CVmTimeZone::get_name(in_stack_ffffffffffffffc8,(size_t *)in_stack_ffffffffffffffc0);
  CVmTimeZoneCache::is_local_zone(G_tzcache_X,zone);
  CVmTimeZone::query(in_stack_ffffffffffffffd0,(vmtzquery *)in_stack_ffffffffffffffc8);
  CVmFile::write_int4(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  CVmFile::write_int4(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  CVmFile::write_str_byte_prefix
            ((CVmFile *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
  CVmFile::write_str_byte_prefix
            ((CVmFile *)in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
             (size_t)in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void CVmObjTimeZone::save_to_file(VMG_ class CVmFile *fp)
{
    /* get our timezone name */
    CVmTimeZone *tz = get_ext()->tz;
    size_t namelen;
    const char *name = tz->get_name(namelen);

    /* if this is the system's local zone, use ":local" as the name */
    if (G_tzcache->is_local_zone(tz))
        name = ":local", namelen = 6;

    /* query the zone data */
    vmtzquery q;
    tz->query(&q);

    /* write our GMT offset, DST offset, abbreviation, and timezone name */
    fp->write_int4(q.gmtofs);
    fp->write_int4(q.save);
    fp->write_str_byte_prefix(q.abbr);
    fp->write_str_byte_prefix(name, namelen);
}